

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compressWeights(void *dst,size_t dstSize,void *weightTable,size_t wtSize)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  U32 maxSymbolValue;
  S16 norm [13];
  U32 count [13];
  BYTE scratchBuffer [64];
  FSE_CTable CTable [59];
  uint local_1cc;
  short local_1c8 [16];
  uint local_1a8 [16];
  undefined1 local_168 [64];
  FSE_CTable local_128 [62];
  
  local_1cc = 0xc;
  if (1 < wtSize) {
    uVar1 = HIST_count_simple(local_1a8,&local_1cc,weightTable,wtSize);
    if (uVar1 == wtSize) {
      return 1;
    }
    if (uVar1 != 1) {
      uVar1 = FSE_optimalTableLog(6,wtSize,local_1cc);
      sVar2 = FSE_normalizeCount(local_1c8,uVar1,local_1a8,wtSize,local_1cc);
      if (0xfffffffffffffff7 < sVar2) {
        return sVar2;
      }
      sVar2 = FSE_writeNCount(dst,dstSize,local_1c8,local_1cc,uVar1);
      if (0xfffffffffffffff7 < sVar2) {
        return sVar2;
      }
      sVar3 = FSE_buildCTable_wksp(local_128,local_1c8,local_1cc,uVar1,local_168,0x40);
      if (0xfffffffffffffff7 < sVar3) {
        return sVar3;
      }
      sVar3 = FSE_compress_usingCTable
                        ((void *)((long)dst + sVar2),dstSize - sVar2,weightTable,wtSize,local_128);
      if (0xfffffffffffffff7 < sVar3) {
        return sVar3;
      }
      if (sVar3 != 0) {
        return (long)((long)dst + sVar2) + (sVar3 - (long)dst);
      }
    }
  }
  return 0;
}

Assistant:

size_t HUF_compressWeights (void* dst, size_t dstSize, const void* weightTable, size_t wtSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32 maxSymbolValue = HUF_TABLELOG_MAX;
    U32 tableLog = MAX_FSE_TABLELOG_FOR_HUFF_HEADER;

    FSE_CTable CTable[FSE_CTABLE_SIZE_U32(MAX_FSE_TABLELOG_FOR_HUFF_HEADER, HUF_TABLELOG_MAX)];
    BYTE scratchBuffer[1<<MAX_FSE_TABLELOG_FOR_HUFF_HEADER];

    U32 count[HUF_TABLELOG_MAX+1];
    S16 norm[HUF_TABLELOG_MAX+1];

    /* init conditions */
    if (wtSize <= 1) return 0;  /* Not compressible */

    /* Scan input and build symbol stats */
    {   unsigned const maxCount = HIST_count_simple(count, &maxSymbolValue, weightTable, wtSize);   /* never fails */
        if (maxCount == wtSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;        /* each symbol present maximum once => not compressible */
    }

    tableLog = FSE_optimalTableLog(tableLog, wtSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, wtSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(hSize, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += hSize;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, sizeof(scratchBuffer)) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, weightTable, wtSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    return op-ostart;
}